

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void console_draw_pct(float _pct)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  float fVar8;
  allocator local_55;
  float local_54;
  string deleteLine;
  
  local_54 = _pct;
  bVar1 = console_is_init();
  if (bVar1) {
    if (cmd_win == (WINDOW *)0x0) {
      uVar5 = 0xfffffffffffffffb;
    }
    else {
      uVar5 = (long)cmd_win->_maxx - 3;
    }
    werase();
    uVar7 = 0;
    box(cmd_win,0,0);
    if ((long)uVar5 < 0) {
      fVar8 = (float)uVar5;
    }
    else {
      fVar8 = (float)(int)uVar5;
    }
    fVar8 = fVar8 * local_54;
    uVar3 = (ulong)fVar8;
    wattr_on(cmd_win,0x200,0);
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = ".";
      if (uVar7 < ((long)(fVar8 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3)) {
        pcVar4 = "#";
      }
      mvwprintw(cmd_win,1,(int)uVar7 + 2,"%s",pcVar4);
    }
    wattr_off(cmd_win,0x200,0);
    wrefresh(cmd_win);
    return;
  }
  std::__cxx11::string::string((string *)&deleteLine,"\x1b[2K\r\x1b[1A",&local_55);
  std::operator<<((ostream *)&std::cout,(string *)&deleteLine);
  std::operator<<((ostream *)&std::cout,"// [ ");
  fVar8 = local_54 * 100.0;
  for (iVar6 = 0; iVar6 != 0x32; iVar6 = iVar6 + 1) {
    pcVar4 = ".";
    if (iVar6 < (int)fVar8 / 2) {
      pcVar4 = "#";
    }
    std::operator<<((ostream *)&std::cout,pcVar4);
  }
  poVar2 = std::operator<<((ostream *)&std::cout," ] ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)fVar8);
  poVar2 = std::operator<<(poVar2,"%");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&deleteLine);
  return;
}

Assistant:

void console_draw_pct(float _pct) {
    #if defined(SUPPORT_NCURSES)

    if (console_is_init()) {
        size_t lines, cols;
        getmaxyx(cmd_win, lines, cols);

        werase(cmd_win);
        box(cmd_win,0, 0);
        // wborder(cmd_win, '|', '|', '-', '-', '+', '+', '+', '+');

        size_t l = (cols-4) * _pct;
        wattron(cmd_win, COLOR_PAIR(2));
        for (size_t i = 0; i < cols-4; i++)
            mvwprintw(cmd_win, 1, 2 + i, "%s", (i < l )? "#" : ".");
        wattroff(cmd_win, COLOR_PAIR(2));

        wrefresh(cmd_win);
    } else 
    #endif
    {
        // Delete previous line
        const std::string deleteLine = "\e[2K\r\e[1A";
        std::cout << deleteLine;

        int pct = 100 * _pct;
        std::cout << "// [ ";
        for (int i = 0; i < 50; i++) {
            if (i < pct/2) {
                std::cout << "#";
            }
            else {
                std::cout << ".";
            }
        }
        std::cout << " ] " << pct << "%" << std::endl;
    }
}